

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O2

void __thiscall
Move::Move(Move *this,Position *initialPosition,Position *lastPosition,NurseSolution *movedNurse)

{
  Position::Position(&this->initialPosition,initialPosition);
  Position::Position(&this->lastPosition,lastPosition);
  this->movedNurse = movedNurse;
  this->tradedNurse = (NurseSolution *)0x0;
  return;
}

Assistant:

Move::Move(Position initialPosition,Position lastPosition, NurseSolution* movedNurse) : initialPosition(initialPosition), lastPosition(lastPosition), movedNurse(movedNurse){}